

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O0

void __thiscall wasm::ReReloop::ReReloop(ReReloop *this)

{
  ReReloop *this_local;
  
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__ReReloop_0271a950;
  std::unique_ptr<CFG::Relooper,std::default_delete<CFG::Relooper>>::
  unique_ptr<std::default_delete<CFG::Relooper>,void>
            ((unique_ptr<CFG::Relooper,std::default_delete<CFG::Relooper>> *)&this->relooper);
  std::unique_ptr<wasm::Builder,std::default_delete<wasm::Builder>>::
  unique_ptr<std::default_delete<wasm::Builder>,void>
            ((unique_ptr<wasm::Builder,std::default_delete<wasm::Builder>> *)&this->builder);
  this->currCFGBlock = (Block *)0x0;
  std::
  map<wasm::Name,_CFG::Block_*,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_CFG::Block_*>_>_>
  ::map(&this->breakTargets);
  std::
  vector<std::shared_ptr<wasm::ReReloop::Task>,_std::allocator<std::shared_ptr<wasm::ReReloop::Task>_>_>
  ::vector(&this->stack);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }